

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O0

int device_init(void)

{
  suseconds_t sVar1;
  suseconds_t sVar2;
  int fd;
  suseconds_t t1;
  suseconds_t t0;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = open_uevent_socket();
  if (local_4 < 0) {
    local_4 = -1;
  }
  else {
    fcntl(local_4,2,1);
    fcntl(local_4,4,0x800);
    sVar1 = get_usecs();
    coldboot(local_4,in_stack_ffffffffffffffd8);
    coldboot(local_4,in_stack_ffffffffffffffd8);
    coldboot(local_4,in_stack_ffffffffffffffd8);
    sVar2 = get_usecs();
    log_write(6,"<6>init: coldboot %ld uS\n",sVar2 - sVar1);
  }
  return local_4;
}

Assistant:

int device_init(void)
{
    suseconds_t t0, t1;
    int fd;

    fd = open_uevent_socket();
    if(fd < 0)
        return -1;

    fcntl(fd, F_SETFD, FD_CLOEXEC);
    fcntl(fd, F_SETFL, O_NONBLOCK);

    t0 = get_usecs();
    coldboot(fd, "/sys/class");
    coldboot(fd, "/sys/block");
    coldboot(fd, "/sys/devices");
    t1 = get_usecs();

    log_event_print("coldboot %ld uS\n", ((long) (t1 - t0)));

    return fd;
}